

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jdmainct.c
# Opt level: O3

void process_data_simple_main
               (j_compress_ptr cinfo,JSAMPARRAY input_buf,JDIMENSION *in_row_ctr,
               JDIMENSION in_rows_avail)

{
  JDIMENSION *pJVar1;
  JDIMENSION JVar2;
  jpeg_c_main_controller *pjVar3;
  uint uVar4;
  boolean bVar5;
  uint uVar6;
  
  pjVar3 = cinfo->main;
  if (*(uint *)&pjVar3[1].start_pass < cinfo->total_iMCU_rows) {
    pJVar1 = (JDIMENSION *)((long)&pjVar3[1].start_pass + 4);
    uVar4 = *(uint *)((long)&pjVar3[1].start_pass + 4);
    do {
      JVar2 = cinfo->min_DCT_v_scaled_size;
      if (uVar4 < JVar2) {
        (*cinfo->prep->pre_process_data)
                  (cinfo,input_buf,in_row_ctr,in_rows_avail,(JSAMPIMAGE)(pjVar3 + 2),pJVar1,JVar2);
        uVar4 = *pJVar1;
        JVar2 = cinfo->min_DCT_v_scaled_size;
      }
      if (uVar4 != JVar2) {
        return;
      }
      bVar5 = (*cinfo->coef->compress_data)(cinfo,(JSAMPIMAGE)(pjVar3 + 2));
      if (bVar5 == 0) {
        if (*(int *)&pjVar3[1].process_data != 0) {
          return;
        }
        *in_row_ctr = *in_row_ctr - 1;
        *(undefined4 *)&pjVar3[1].process_data = 1;
        return;
      }
      if (*(int *)&pjVar3[1].process_data != 0) {
        *in_row_ctr = *in_row_ctr + 1;
        *(undefined4 *)&pjVar3[1].process_data = 0;
      }
      *(undefined4 *)((long)&pjVar3[1].start_pass + 4) = 0;
      uVar6 = *(int *)&pjVar3[1].start_pass + 1;
      *(uint *)&pjVar3[1].start_pass = uVar6;
      uVar4 = 0;
    } while (uVar6 < cinfo->total_iMCU_rows);
  }
  return;
}

Assistant:

METHODDEF(void)
process_data_simple_main (j_decompress_ptr cinfo,
			  JSAMPARRAY output_buf, JDIMENSION *out_row_ctr,
			  JDIMENSION out_rows_avail)
{
  my_main_ptr main = (my_main_ptr) cinfo->main;
  JDIMENSION rowgroups_avail;

  /* Read input data if we haven't filled the main buffer yet */
  if (! main->buffer_full) {
    if (! (*cinfo->coef->decompress_data) (cinfo, main->buffer))
      return;			/* suspension forced, can do nothing more */
    main->buffer_full = TRUE;	/* OK, we have an iMCU row to work with */
  }

  /* There are always min_DCT_scaled_size row groups in an iMCU row. */
  rowgroups_avail = (JDIMENSION) cinfo->min_DCT_v_scaled_size;
  /* Note: at the bottom of the image, we may pass extra garbage row groups
   * to the postprocessor.  The postprocessor has to check for bottom
   * of image anyway (at row resolution), so no point in us doing it too.
   */

  /* Feed the postprocessor */
  (*cinfo->post->post_process_data) (cinfo, main->buffer,
				     &main->rowgroup_ctr, rowgroups_avail,
				     output_buf, out_row_ctr, out_rows_avail);

  /* Has postprocessor consumed all the data yet? If so, mark buffer empty */
  if (main->rowgroup_ctr >= rowgroups_avail) {
    main->buffer_full = FALSE;
    main->rowgroup_ctr = 0;
  }
}